

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<unsigned_long,_long>::Run
          (DataTransform<unsigned_long,_long> *this,istream *input_stream)

{
  ulong uVar1;
  istream *in_RSI;
  long in_RDI;
  bool bVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  ostringstream error_message;
  bool is_clipped;
  long output_data;
  invalid_argument *anon_var_0;
  string word;
  unsigned_long input_data;
  int index;
  char buffer [128];
  allocator *in_stack_fffffffffffffd08;
  ostringstream *in_stack_fffffffffffffd10;
  ostream *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined6 in_stack_fffffffffffffd28;
  undefined2 in_stack_fffffffffffffd2e;
  allocator local_289;
  string local_288 [32];
  ostringstream local_268 [352];
  ostringstream *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  int local_d8;
  string local_c8 [32];
  ulong local_a8;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar2 = sptk::ReadStream<unsigned_long>
                        ((unsigned_long *)in_stack_fffffffffffffd18,
                         (istream *)in_stack_fffffffffffffd10);
      if (!bVar2) goto LAB_00165464;
    }
    else {
      std::__cxx11::string::string(local_c8);
      std::operator>>(local_18,local_c8);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffd10,(size_t *)in_stack_fffffffffffffd08)
        ;
        in_stack_fffffffffffffd24 = SUB104(in_ST0,0);
        in_stack_fffffffffffffd28 = (undefined6)((unkuint10)in_ST0 >> 0x20);
        lVar3 = (longdouble)9.223372e+18;
        lVar4 = (longdouble)0;
        if (lVar3 <= in_ST0) {
          lVar4 = lVar3;
        }
        local_a8 = (long)ROUND(in_ST0 - lVar4) ^ (ulong)(lVar3 <= in_ST0) << 0x3f;
        local_d8 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      else {
        local_d8 = 2;
      }
      std::__cxx11::string::~string(local_c8);
      if (local_d8 != 0) {
        if (local_d8 != 1) {
LAB_00165464:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_001654a0;
      }
      in_stack_fffffffffffffd20 = 0;
    }
    bVar2 = false;
    if (*(long *)(in_RDI + 0x38) < *(long *)(in_RDI + 0x40)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)local_a8 < *(long *)(in_RDI + 0x38)) {
          bVar2 = true;
        }
        else {
          bVar2 = *(long *)(in_RDI + 0x40) < (long)local_a8;
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        if (local_a8 < *(ulong *)(in_RDI + 0x38)) {
          bVar2 = true;
        }
        else {
          bVar2 = *(ulong *)(in_RDI + 0x40) < local_a8;
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        if ((float)*(long *)(in_RDI + 0x38) <=
            *(float *)(&DAT_00196b40 + (ulong)((long)local_a8 < 0) * 4) + (float)(long)local_a8) {
          bVar2 = (float)*(long *)(in_RDI + 0x40) <
                  *(float *)(&DAT_00196b40 + (ulong)((long)local_a8 < 0) * 4) +
                  (float)(long)local_a8;
          in_ST5 = in_ST4;
        }
        else {
          bVar2 = true;
        }
      }
    }
    if ((bVar2) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffd10 = local_268;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd18 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd10,local_9c);
      std::operator<<(in_stack_fffffffffffffd18,"th data is over the range of output type");
      in_stack_fffffffffffffd08 = &local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"x2x",in_stack_fffffffffffffd08);
      sptk::PrintErrorMessage(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      bVar2 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar2) {
        local_1 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_268);
      if (bVar2) goto LAB_001654a0;
    }
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar2 = sptk::WriteStream<long>((long)in_stack_fffffffffffffd08,(ostream *)0x16543c);
      if (!bVar2) {
        local_1 = 0;
LAB_001654a0:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar2 = sptk::SnPrintf<long>
                        (CONCAT26(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd28),
                         (string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                         (size_t)in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_001654a0;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }